

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O2

void __thiscall
Assimp::MD5::MD5MeshParser::MD5MeshParser(MD5MeshParser *this,SectionList *mSections)

{
  string *__lhs;
  pointer this_00;
  FaceList *this_01;
  VertexList *this_02;
  char cVar1;
  pointer pSVar2;
  pointer pEVar3;
  pointer pBVar4;
  pointer pMVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  Logger *pLVar9;
  ulong uVar10;
  ulong uVar11;
  uint *puVar12;
  Element *elem;
  pointer pSVar13;
  pointer pEVar14;
  char *pcVar15;
  uint i;
  long lVar16;
  pointer pWVar17;
  pointer pVVar18;
  pointer paVar19;
  char *local_4e8 [9];
  undefined1 local_49b [1131];
  
  (this->mJoints).super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mJoints).super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mMeshes).super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mJoints).super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mMeshes).super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mMeshes).super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar9 = DefaultLogger::get();
  Logger::debug(pLVar9,"MD5MeshParser begin");
  pSVar2 = (mSections->
           super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar13 = (mSections->
                 super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>).
                 _M_impl.super__Vector_impl_data._M_start; pSVar13 != pSVar2; pSVar13 = pSVar13 + 1)
  {
    __lhs = &pSVar13->mName;
    bVar6 = std::operator==(__lhs,"numMeshes");
    if (bVar6) {
      uVar7 = strtoul10((pSVar13->mGlobalValue)._M_dataplus._M_p,(char **)0x0);
      std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::reserve
                (&this->mMeshes,(ulong)uVar7);
    }
    else {
      bVar6 = std::operator==(__lhs,"numJoints");
      if (bVar6) {
        uVar7 = strtoul10((pSVar13->mGlobalValue)._M_dataplus._M_p,(char **)0x0);
        std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::reserve
                  (&this->mJoints,(ulong)uVar7);
      }
      else {
        bVar6 = std::operator==(__lhs,"joints");
        if (bVar6) {
          pEVar3 = (pSVar13->mElements).
                   super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pEVar14 = (pSVar13->mElements).
                         super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                         ._M_impl.super__Vector_impl_data._M_start; pEVar14 != pEVar3;
              pEVar14 = pEVar14 + 1) {
            memset((BoneDesc *)local_4e8,0,0x4b4);
            BoneDesc::BoneDesc((BoneDesc *)local_4e8);
            std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
            emplace_back<Assimp::MD5::BoneDesc>(&this->mJoints,(BoneDesc *)local_4e8);
            pBVar4 = (this->mJoints).
                     super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pcVar15 = pEVar14->szStart;
            do {
              cVar1 = *pcVar15;
              pcVar15 = pcVar15 + 1;
            } while (cVar1 != '\"');
            uVar10 = 0xffffffffffffffff;
            do {
              uVar11 = uVar10;
              uVar10 = uVar11 + 1;
            } while (pcVar15[uVar11 + 1] != '\"');
            local_4e8[0] = pcVar15 + uVar11 + 2;
            pBVar4[-1].super_BaseJointDescription.mName.length = (ai_uint32)uVar10;
            memcpy(pBVar4[-1].super_BaseJointDescription.mName.data,pcVar15,uVar10 & 0xffffffff);
            *(undefined1 *)((long)pBVar4 + ((uVar10 & 0xffffffff) - 0x4b0)) = 0;
            bVar6 = SkipSpaces<char>(local_4e8);
            if (!bVar6) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
            }
            iVar8 = strtol10(local_4e8[0],local_4e8);
            pBVar4[-1].super_BaseJointDescription.mParentIndex = iVar8;
            bVar6 = SkipSpaces<char>(local_4e8);
            if (!bVar6) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
            }
            pcVar15 = local_4e8[0] + 1;
            cVar1 = *local_4e8[0];
            local_4e8[0] = pcVar15;
            if (cVar1 != '(') {
              MD5Parser::ReportWarning("Unexpected token: ( was expected",pEVar14->iLineNumber);
            }
            bVar6 = SkipSpaces<char>(local_4e8);
            if (!bVar6) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
            }
            local_4e8[0] = fast_atoreal_move<float>(local_4e8[0],&pBVar4[-1].mPositionXYZ.x,true);
            bVar6 = SkipSpaces<char>(local_4e8);
            if (!bVar6) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
            }
            local_4e8[0] = fast_atoreal_move<float>(local_4e8[0],&pBVar4[-1].mPositionXYZ.y,true);
            bVar6 = SkipSpaces<char>(local_4e8);
            if (!bVar6) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
            }
            local_4e8[0] = fast_atoreal_move<float>(local_4e8[0],&pBVar4[-1].mPositionXYZ.z,true);
            bVar6 = SkipSpaces<char>(local_4e8);
            if (!bVar6) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
            }
            pcVar15 = local_4e8[0] + 1;
            cVar1 = *local_4e8[0];
            local_4e8[0] = pcVar15;
            if (cVar1 != ')') {
              MD5Parser::ReportWarning("Unexpected token: ) was expected",pEVar14->iLineNumber);
            }
            bVar6 = SkipSpaces<char>(local_4e8);
            if (!bVar6) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
            }
            pcVar15 = local_4e8[0] + 1;
            cVar1 = *local_4e8[0];
            local_4e8[0] = pcVar15;
            if (cVar1 != '(') {
              MD5Parser::ReportWarning("Unexpected token: ( was expected",pEVar14->iLineNumber);
            }
            bVar6 = SkipSpaces<char>(local_4e8);
            if (!bVar6) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
            }
            local_4e8[0] = fast_atoreal_move<float>(local_4e8[0],&pBVar4[-1].mRotationQuat.x,true);
            bVar6 = SkipSpaces<char>(local_4e8);
            if (!bVar6) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
            }
            local_4e8[0] = fast_atoreal_move<float>(local_4e8[0],&pBVar4[-1].mRotationQuat.y,true);
            bVar6 = SkipSpaces<char>(local_4e8);
            if (!bVar6) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
            }
            local_4e8[0] = fast_atoreal_move<float>(local_4e8[0],&pBVar4[-1].mRotationQuat.z,true);
            bVar6 = SkipSpaces<char>(local_4e8);
            if (!bVar6) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
            }
            pcVar15 = local_4e8[0] + 1;
            cVar1 = *local_4e8[0];
            local_4e8[0] = pcVar15;
            if (cVar1 != ')') {
              MD5Parser::ReportWarning("Unexpected token: ) was expected",pEVar14->iLineNumber);
            }
          }
        }
        else {
          bVar6 = std::operator==(__lhs,"mesh");
          if (bVar6) {
            memset((BoneDesc *)local_4e8,0,0x450);
            memset(local_49b,0x1b,0x3ff);
            std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::
            emplace_back<Assimp::MD5::MeshDesc>(&this->mMeshes,(MeshDesc *)local_4e8);
            MeshDesc::~MeshDesc((MeshDesc *)local_4e8);
            pMVar5 = (this->mMeshes).
                     super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            this_00 = pMVar5 + -1;
            pEVar3 = (pSVar13->mElements).
                     super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            this_01 = &pMVar5[-1].mFaces;
            this_02 = &pMVar5[-1].mVertices;
            for (pEVar14 = (pSVar13->mElements).
                           super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                           ._M_impl.super__Vector_impl_data._M_start; pEVar14 != pEVar3;
                pEVar14 = pEVar14 + 1) {
              local_4e8[0] = pEVar14->szStart;
              bVar6 = TokenMatch<char_const>(local_4e8,"shader",6);
              if (bVar6) {
                bVar6 = SkipSpaces<char>(local_4e8);
                if (!bVar6) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                }
                do {
                  pcVar15 = local_4e8[0] + 1;
                  cVar1 = *local_4e8[0];
                  local_4e8[0] = pcVar15;
                } while (cVar1 != '\"');
                uVar10 = 0xffffffffffffffff;
                do {
                  uVar11 = uVar10;
                  uVar10 = uVar11 + 1;
                } while (pcVar15[uVar11 + 1] != '\"');
                local_4e8[0] = pcVar15 + uVar11 + 2;
                pMVar5[-1].mShader.length = (ai_uint32)uVar10;
                memcpy(pMVar5[-1].mShader.data,pcVar15,uVar10 & 0xffffffff);
                *(undefined1 *)((long)pMVar5 + ((uVar10 & 0xffffffff) - 0x404)) = 0;
              }
              else {
                bVar6 = TokenMatch<char_const>(local_4e8,"numverts",8);
                if (bVar6) {
                  bVar6 = SkipSpaces<char>(local_4e8);
                  if (!bVar6) {
                    MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                  }
                  uVar7 = strtoul10(local_4e8[0],(char **)0x0);
                  std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::
                  resize(this_02,(ulong)uVar7);
                }
                else {
                  bVar6 = TokenMatch<char_const>(local_4e8,"numtris",7);
                  if (bVar6) {
                    bVar6 = SkipSpaces<char>(local_4e8);
                    if (!bVar6) {
                      MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                    }
                    uVar7 = strtoul10(local_4e8[0],(char **)0x0);
                    std::vector<aiFace,_std::allocator<aiFace>_>::resize(this_01,(ulong)uVar7);
                  }
                  else {
                    bVar6 = TokenMatch<char_const>(local_4e8,"numweights",10);
                    if (bVar6) {
                      bVar6 = SkipSpaces<char>(local_4e8);
                      if (!bVar6) {
                        MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                      }
                      uVar7 = strtoul10(local_4e8[0],(char **)0x0);
                      std::vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                      ::resize(&this_00->mWeights,(ulong)uVar7);
                    }
                    else {
                      bVar6 = TokenMatch<char_const>(local_4e8,"vert",4);
                      if (bVar6) {
                        bVar6 = SkipSpaces<char>(local_4e8);
                        if (!bVar6) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        uVar7 = strtoul10(local_4e8[0],local_4e8);
                        bVar6 = SkipSpaces<char>(local_4e8);
                        if (!bVar6) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        pVVar18 = pMVar5[-1].mVertices.
                                  super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        if ((ulong)((long)pMVar5[-1].mVertices.
                                          super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar18
                                   >> 4) <= (ulong)uVar7) {
                          std::
                          vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                          ::resize(this_02,(ulong)(uVar7 + 1));
                          pVVar18 = (this_02->
                                    super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                                    )._M_impl.super__Vector_impl_data._M_start;
                        }
                        pcVar15 = local_4e8[0] + 1;
                        cVar1 = *local_4e8[0];
                        local_4e8[0] = pcVar15;
                        if (cVar1 != '(') {
                          MD5Parser::ReportWarning
                                    ("Unexpected token: ( was expected",pEVar14->iLineNumber);
                        }
                        bVar6 = SkipSpaces<char>(local_4e8);
                        if (!bVar6) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        pVVar18 = pVVar18 + uVar7;
                        local_4e8[0] = fast_atoreal_move<float>(local_4e8[0],(float *)pVVar18,true);
                        bVar6 = SkipSpaces<char>(local_4e8);
                        if (!bVar6) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        local_4e8[0] = fast_atoreal_move<float>(local_4e8[0],&(pVVar18->mUV).y,true)
                        ;
                        bVar6 = SkipSpaces<char>(local_4e8);
                        if (!bVar6) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        pcVar15 = local_4e8[0] + 1;
                        cVar1 = *local_4e8[0];
                        local_4e8[0] = pcVar15;
                        if (cVar1 != ')') {
                          MD5Parser::ReportWarning
                                    ("Unexpected token: ) was expected",pEVar14->iLineNumber);
                        }
                        bVar6 = SkipSpaces<char>(local_4e8);
                        if (!bVar6) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        uVar7 = strtoul10(local_4e8[0],local_4e8);
                        pVVar18->mFirstWeight = uVar7;
                        bVar6 = SkipSpaces<char>(local_4e8);
                        if (!bVar6) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        uVar7 = strtoul10(local_4e8[0],local_4e8);
                        pVVar18->mNumWeights = uVar7;
                      }
                      else {
                        bVar6 = TokenMatch<char_const>(local_4e8,"tri",3);
                        if (bVar6) {
                          bVar6 = SkipSpaces<char>(local_4e8);
                          if (!bVar6) {
                            MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                          }
                          uVar7 = strtoul10(local_4e8[0],local_4e8);
                          uVar10 = (ulong)uVar7;
                          paVar19 = pMVar5[-1].mFaces.
                                    super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                                    super__Vector_impl_data._M_start;
                          if ((ulong)((long)pMVar5[-1].mFaces.
                                            super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)paVar19 >> 4) <= uVar10) {
                            std::vector<aiFace,_std::allocator<aiFace>_>::resize
                                      (this_01,(ulong)(uVar7 + 1));
                            paVar19 = (this_01->super__Vector_base<aiFace,_std::allocator<aiFace>_>)
                                      ._M_impl.super__Vector_impl_data._M_start;
                          }
                          paVar19[uVar10].mNumIndices = 3;
                          puVar12 = (uint *)operator_new__(0xc);
                          paVar19[uVar10].mIndices = puVar12;
                          for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
                            bVar6 = SkipSpaces<char>(local_4e8);
                            if (!bVar6) {
                              MD5Parser::ReportWarning
                                        ("Unexpected end of line",pEVar14->iLineNumber);
                            }
                            uVar7 = strtoul10(local_4e8[0],local_4e8);
                            paVar19[uVar10].mIndices[lVar16] = uVar7;
                          }
                        }
                        else {
                          bVar6 = TokenMatch<char_const>(local_4e8,"weight",6);
                          if (bVar6) {
                            bVar6 = SkipSpaces<char>(local_4e8);
                            if (!bVar6) {
                              MD5Parser::ReportWarning
                                        ("Unexpected end of line",pEVar14->iLineNumber);
                            }
                            uVar7 = strtoul10(local_4e8[0],local_4e8);
                            bVar6 = SkipSpaces<char>(local_4e8);
                            if (!bVar6) {
                              MD5Parser::ReportWarning
                                        ("Unexpected end of line",pEVar14->iLineNumber);
                            }
                            uVar10 = (ulong)uVar7;
                            pWVar17 = pMVar5[-1].mWeights.
                                      super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            if ((ulong)(((long)pMVar5[-1].mWeights.
                                               super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pWVar17) / 0x14) <= uVar10) {
                              std::
                              vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                              ::resize(&this_00->mWeights,(ulong)(uVar7 + 1));
                              pWVar17 = (this_00->mWeights).
                                        super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                            }
                            uVar7 = strtoul10(local_4e8[0],local_4e8);
                            pWVar17[uVar10].mBone = uVar7;
                            bVar6 = SkipSpaces<char>(local_4e8);
                            if (!bVar6) {
                              MD5Parser::ReportWarning
                                        ("Unexpected end of line",pEVar14->iLineNumber);
                            }
                            local_4e8[0] = fast_atoreal_move<float>
                                                     (local_4e8[0],&pWVar17[uVar10].mWeight,true);
                            bVar6 = SkipSpaces<char>(local_4e8);
                            if (!bVar6) {
                              MD5Parser::ReportWarning
                                        ("Unexpected end of line",pEVar14->iLineNumber);
                            }
                            pcVar15 = local_4e8[0] + 1;
                            cVar1 = *local_4e8[0];
                            local_4e8[0] = pcVar15;
                            if (cVar1 != '(') {
                              MD5Parser::ReportWarning
                                        ("Unexpected token: ( was expected",pEVar14->iLineNumber);
                            }
                            bVar6 = SkipSpaces<char>(local_4e8);
                            if (!bVar6) {
                              MD5Parser::ReportWarning
                                        ("Unexpected end of line",pEVar14->iLineNumber);
                            }
                            local_4e8[0] = fast_atoreal_move<float>
                                                     (local_4e8[0],
                                                      &pWVar17[uVar10].vOffsetPosition.x,true);
                            bVar6 = SkipSpaces<char>(local_4e8);
                            if (!bVar6) {
                              MD5Parser::ReportWarning
                                        ("Unexpected end of line",pEVar14->iLineNumber);
                            }
                            local_4e8[0] = fast_atoreal_move<float>
                                                     (local_4e8[0],
                                                      &pWVar17[uVar10].vOffsetPosition.y,true);
                            bVar6 = SkipSpaces<char>(local_4e8);
                            if (!bVar6) {
                              MD5Parser::ReportWarning
                                        ("Unexpected end of line",pEVar14->iLineNumber);
                            }
                            local_4e8[0] = fast_atoreal_move<float>
                                                     (local_4e8[0],
                                                      &pWVar17[uVar10].vOffsetPosition.z,true);
                            bVar6 = SkipSpaces<char>(local_4e8);
                            if (!bVar6) {
                              MD5Parser::ReportWarning
                                        ("Unexpected end of line",pEVar14->iLineNumber);
                            }
                            pcVar15 = local_4e8[0] + 1;
                            cVar1 = *local_4e8[0];
                            local_4e8[0] = pcVar15;
                            if (cVar1 != ')') {
                              MD5Parser::ReportWarning
                                        ("Unexpected token: ) was expected",pEVar14->iLineNumber);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pLVar9 = DefaultLogger::get();
  Logger::debug(pLVar9,"MD5MeshParser end");
  return;
}

Assistant:

MD5MeshParser::MD5MeshParser(SectionList& mSections)
{
    ASSIMP_LOG_DEBUG("MD5MeshParser begin");

    // now parse all sections
    for (SectionList::const_iterator iter =  mSections.begin(), iterEnd = mSections.end();iter != iterEnd;++iter){
        if ( (*iter).mName == "numMeshes")  {
            mMeshes.reserve(::strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ( (*iter).mName == "numJoints") {
            mJoints.reserve(::strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "joints") {
            // "origin" -1 ( -0.000000 0.016430 -0.006044 ) ( 0.707107 0.000000 0.707107 )
            for (const auto & elem : (*iter).mElements){
                mJoints.push_back(BoneDesc());
                BoneDesc& desc = mJoints.back();
				
                const char* sz = elem.szStart;
				AI_MD5_PARSE_STRING_IN_QUOTATION(desc.mName);
                AI_MD5_SKIP_SPACES();

                // negative values, at least -1, is allowed here
                desc.mParentIndex = (int)strtol10(sz,&sz);

                AI_MD5_READ_TRIPLE(desc.mPositionXYZ);
                AI_MD5_READ_TRIPLE(desc.mRotationQuat); // normalized quaternion, so w is not there
            }
        }
        else if ((*iter).mName == "mesh")   {
            mMeshes.push_back(MeshDesc());
            MeshDesc& desc = mMeshes.back();

            for (const auto & elem : (*iter).mElements){
                const char* sz = elem.szStart;

                // shader attribute
                if (TokenMatch(sz,"shader",6))  {
                    AI_MD5_SKIP_SPACES();
                    AI_MD5_PARSE_STRING_IN_QUOTATION(desc.mShader);
                }
                // numverts attribute
                else if (TokenMatch(sz,"numverts",8))   {
                    AI_MD5_SKIP_SPACES();
                    desc.mVertices.resize(strtoul10(sz));
                }
                // numtris attribute
                else if (TokenMatch(sz,"numtris",7))    {
                    AI_MD5_SKIP_SPACES();
                    desc.mFaces.resize(strtoul10(sz));
                }
                // numweights attribute
                else if (TokenMatch(sz,"numweights",10))    {
                    AI_MD5_SKIP_SPACES();
                    desc.mWeights.resize(strtoul10(sz));
                }
                // vert attribute
                // "vert 0 ( 0.394531 0.513672 ) 0 1"
                else if (TokenMatch(sz,"vert",4))   {
                    AI_MD5_SKIP_SPACES();
                    const unsigned int idx = ::strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    if (idx >= desc.mVertices.size())
                        desc.mVertices.resize(idx+1);

                    VertexDesc& vert = desc.mVertices[idx];
                    if ('(' != *sz++)
                        MD5Parser::ReportWarning("Unexpected token: ( was expected",elem.iLineNumber);
                    AI_MD5_SKIP_SPACES();
                    sz = fast_atoreal_move<float>(sz,(float&)vert.mUV.x);
                    AI_MD5_SKIP_SPACES();
                    sz = fast_atoreal_move<float>(sz,(float&)vert.mUV.y);
                    AI_MD5_SKIP_SPACES();
                    if (')' != *sz++)
                        MD5Parser::ReportWarning("Unexpected token: ) was expected",elem.iLineNumber);
                    AI_MD5_SKIP_SPACES();
                    vert.mFirstWeight = ::strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    vert.mNumWeights = ::strtoul10(sz,&sz);
                }
                // tri attribute
                // "tri 0 15 13 12"
                else if (TokenMatch(sz,"tri",3)) {
                    AI_MD5_SKIP_SPACES();
                    const unsigned int idx = strtoul10(sz,&sz);
                    if (idx >= desc.mFaces.size())
                        desc.mFaces.resize(idx+1);

                    aiFace& face = desc.mFaces[idx];
                    face.mIndices = new unsigned int[face.mNumIndices = 3];
                    for (unsigned int i = 0; i < 3;++i) {
                        AI_MD5_SKIP_SPACES();
                        face.mIndices[i] = strtoul10(sz,&sz);
                    }
                }
                // weight attribute
                // "weight 362 5 0.500000 ( -3.553583 11.893474 9.719339 )"
                else if (TokenMatch(sz,"weight",6)) {
                    AI_MD5_SKIP_SPACES();
                    const unsigned int idx = strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    if (idx >= desc.mWeights.size())
                        desc.mWeights.resize(idx+1);

                    WeightDesc& weight = desc.mWeights[idx];
                    weight.mBone = strtoul10(sz,&sz);
                    AI_MD5_SKIP_SPACES();
                    sz = fast_atoreal_move<float>(sz,weight.mWeight);
                    AI_MD5_READ_TRIPLE(weight.vOffsetPosition);
                }
            }
        }
    }
    ASSIMP_LOG_DEBUG("MD5MeshParser end");
}